

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFGeneric3<(moira::Instr)203,(moira::Mode)4,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  Ea<(moira::Mode)4,_4> result;
  u32 local_34;
  ushort local_30;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  uVar6 = (uVar4 & 0xffff) >> 10;
  if (((uVar4 & 0xffff) >> 0xe & 1) == 0) {
    cVar3 = 'f';
    lVar5 = 0;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar3;
      cVar3 = "bftst"[lVar5 + 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar2 = str->ptr;
        str->ptr = pcVar2 + 1;
        *pcVar2 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    StrWriter::operator<<(str,(Fp)(uVar6 & 7));
    return;
  }
  cVar3 = 'f';
  lVar5 = 0;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = "bftst"[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  StrWriter::operator<<(str,(Ffmt)(uVar6 & 7));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  local_34 = *addr;
  local_30 = op & 7;
  StrWriter::operator<<(str,(Ea<(moira::Mode)4,_4> *)&local_34);
  return;
}

Assistant:

void
Moira::dasmFGeneric3(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer

                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }
}